

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

float ncnn::reduction<ncnn::reduction_op_sumexp>
                (float v0,float *ptr,int size0,int size1,int stride1)

{
  undefined4 in_ECX;
  int in_EDX;
  int in_ESI;
  float in_XMM0_Da;
  int j;
  int i;
  float sum;
  reduction_op_sumexp op;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar1;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe0;
  
  for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 1) {
    for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
      in_XMM0_Da = reduction_op_sumexp::operator()
                             ((reduction_op_sumexp *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                              (float *)CONCAT44(in_XMM0_Da,iVar2),
                              (float *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    }
  }
  return in_XMM0_Da;
}

Assistant:

static float reduction(float v0, const float* ptr, int size0, int size1, int stride1)
{
    Op op;

    float sum = v0;
    for (int i = 0; i < size1; i++)
    {
        for (int j = 0; j < size0; j++)
        {
            sum = op(sum, ptr[j]);
        }
        ptr += stride1;
    }

    return sum;
}